

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

Array2D<float> * __thiscall
pbrt::Array2D<float>::operator=(Array2D<float> *this,Array2D<float> *other)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  Bounds2<int> *in_RSI;
  Array2D<float> *in_RDI;
  int i_2;
  int no;
  int i_1;
  int n_1;
  int i;
  int n;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffffc8;
  int local_28;
  int local_20;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffec;
  
  bVar1 = pstd::pmr::operator==
                    ((polymorphic_allocator<std::byte> *)in_RDI,in_stack_ffffffffffffffc8);
  if (bVar1) {
    pstd::swap<pbrt::Bounds2<int>>(&in_RDI->extent,in_RSI);
    pstd::swap<float*>(&in_RDI->values,(float **)&in_RSI[1].pMax);
  }
  else {
    bVar1 = Bounds2<int>::operator==
                      (in_RSI,(Bounds2<int> *)
                              CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (bVar1) {
      iVar2 = Bounds2<int>::Area(&in_RDI->extent);
      for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
        pstd::pmr::polymorphic_allocator<std::byte>::destroy<float>
                  (&in_RDI->allocator,in_RDI->values + iVar4);
        pstd::pmr::polymorphic_allocator<std::byte>::construct<float,float&>
                  (&in_RDI->allocator,in_RDI->values + iVar4,
                   (float *)((long)in_RSI[1].pMax.super_Tuple2<pbrt::Point2,_int> + (long)iVar4 * 4)
                  );
      }
      (in_RDI->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
           (in_RSI->pMin).super_Tuple2<pbrt::Point2,_int>;
      (in_RDI->extent).pMax.super_Tuple2<pbrt::Point2,_int> =
           (in_RSI->pMax).super_Tuple2<pbrt::Point2,_int>;
    }
    else {
      iVar2 = Bounds2<int>::Area(&in_RDI->extent);
      for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
        pstd::pmr::polymorphic_allocator<std::byte>::destroy<float>
                  (&in_RDI->allocator,in_RDI->values + local_20);
      }
      pstd::pmr::polymorphic_allocator<std::byte>::deallocate_object<float>
                ((polymorphic_allocator<std::byte> *)in_RDI,(float *)in_stack_ffffffffffffffc8,
                 0x8e3efc);
      iVar2 = Bounds2<int>::Area(&in_RDI->extent);
      pfVar3 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<float>
                         ((polymorphic_allocator<std::byte> *)in_RDI,
                          (size_t)in_stack_ffffffffffffffc8);
      in_RDI->values = pfVar3;
      for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
        pstd::pmr::polymorphic_allocator<std::byte>::construct<float,float&>
                  (&in_RDI->allocator,in_RDI->values + local_28,
                   (float *)((long)in_RSI[1].pMax.super_Tuple2<pbrt::Point2,_int> +
                            (long)local_28 * 4));
      }
    }
  }
  return in_RDI;
}

Assistant:

Array2D &operator=(Array2D &&other) {
        if (allocator == other.allocator) {
            pstd::swap(extent, other.extent);
            pstd::swap(values, other.values);
        } else if (extent == other.extent) {
            int n = extent.Area();
            for (int i = 0; i < n; ++i) {
                allocator.destroy(values + i);
                allocator.construct(values + i, other.values[i]);
            }
            extent = other.extent;
        } else {
            int n = extent.Area();
            for (int i = 0; i < n; ++i)
                allocator.destroy(values + i);
            allocator.deallocate_object(values, n);

            int no = other.extent.Area();
            values = allocator.allocate_object<T>(no);
            for (int i = 0; i < no; ++i)
                allocator.construct(values + i, other.values[i]);
        }
        return *this;
    }